

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_uninitialized_relocate_n<QPropertyBindingPrivatePtr,long_long>
               (QPropertyBindingPrivatePtr *first,longlong n,QPropertyBindingPrivatePtr *out)

{
  longlong in_RDX;
  QPropertyBindingPrivatePtr *in_RSI;
  longlong in_RDI;
  
  q_uninitialized_move_if_noexcept_n<QPropertyBindingPrivatePtr,long_long>(out,in_RDI,in_RSI);
  std::destroy_n<QPropertyBindingPrivatePtr*,long_long>(in_RSI,in_RDX);
  return;
}

Assistant:

void q_uninitialized_relocate_n(T* first, N n, T* out)
{
    if constexpr (QTypeInfo<T>::isRelocatable) {
        static_assert(std::is_copy_constructible_v<T> || std::is_move_constructible_v<T>,
                      "Refusing to relocate this non-copy/non-move-constructible type.");
        if (n != N(0)) { // even if N == 0, out == nullptr or first == nullptr are UB for memcpy()
            std::memcpy(static_cast<void *>(out),
                        static_cast<const void *>(first),
                        n * sizeof(T));
        }
    } else {
        q_uninitialized_move_if_noexcept_n(first, n, out);
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(first, n);
    }
}